

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,string *source,bool transposed,double solve_error_norm,
          double residual_error_norm,bool force)

{
  HighsOptions *pHVar1;
  HighsLogType type_00;
  HighsLogType HVar2;
  HighsDebugStatus HVar3;
  allocator local_79;
  double local_78;
  double local_70;
  string value_adjective;
  string type;
  
  pHVar1 = this->options_;
  value_adjective._M_dataplus._M_p = (pointer)&value_adjective.field_2;
  value_adjective._M_string_length = 0;
  value_adjective.field_2._M_local_buf[0] = '\0';
  local_78 = solve_error_norm;
  local_70 = residual_error_norm;
  std::__cxx11::string::string((string *)&type,"",&local_79);
  if (transposed) {
    std::__cxx11::string::assign((char *)&type);
  }
  if ((local_78 != 0.0) || (NAN(local_78))) {
    if (local_78 <= kSolveExcessiveError) {
      if (local_78 <= 1e-08) {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar2 = kInfo;
      }
      else {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar2 = kWarning;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar2 = kError;
    }
    type_00 = kInfo;
    if (!force) {
      type_00 = HVar2;
    }
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,type_00,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",local_78,
                value_adjective._M_dataplus._M_p,type._M_dataplus._M_p,(source->_M_dataplus)._M_p);
  }
  if ((local_70 != 0.0) || (NAN(local_70))) {
    if (local_70 <= kResidualExcessiveError) {
      if (1e-08 < local_70) {
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar2 = kWarning;
        HVar3 = kWarning;
      }
      else {
        HVar3 = kOk;
        std::__cxx11::string::assign((char *)&value_adjective);
        HVar2 = kInfo;
      }
    }
    else {
      std::__cxx11::string::assign((char *)&value_adjective);
      HVar2 = kError;
      HVar3 = kError;
    }
    if (force) {
      HVar2 = kInfo;
    }
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,HVar2,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s residual error\n",local_70,
                value_adjective._M_dataplus._M_p,type._M_dataplus._M_p,(source->_M_dataplus)._M_p);
  }
  else {
    HVar3 = kOk;
  }
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&value_adjective);
  return HVar3;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const std::string source, const bool transposed,
    const double solve_error_norm, const double residual_error_norm,
    const bool force) const {
  const HighsOptions* options = this->options_;
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  std::string type = "";
  if (transposed) type = "transposed ";
  if (solve_error_norm) {
    if (solve_error_norm > kSolveExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
    } else if (solve_error_norm > kSolveLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    //    printf("%s\n", value_adjective.c_str());
    //    printf("%g\n", solve_error_norm);
    //    printf("%s\n", type.c_str());
    //    printf("%s\n", source.c_str());
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",
                value_adjective.c_str(), solve_error_norm, type.c_str(),
                source.c_str());
  }

  if (residual_error_norm) {
    if (residual_error_norm > kResidualExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (residual_error_norm > kResidualLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s "
                "residual error\n",
                value_adjective.c_str(), residual_error_norm, type.c_str(),
                source.c_str());
  }
  return return_status;
}